

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-ping-udp.c
# Opt level: O3

void pinger_read_cb(uv_udp_t *udp,ssize_t nread,uv_buf_t *buf,sockaddr *addr,uint flags)

{
  pinger_t_conflict *pinger;
  int iVar1;
  uint64_t uVar2;
  ulong uVar3;
  uv_udp_t *handle;
  long lVar4;
  uv_buf_t uStack_50;
  code *pcStack_40;
  uv_udp_t *local_38;
  
  if (0 < nread) {
    pinger = (pinger_t_conflict *)udp->data;
    lVar4 = 0;
    local_38 = udp;
    do {
      if (buf->base[lVar4] != PING[pinger->state]) {
        pcStack_40 = pinger_write_ping;
        pinger_read_cb_cold_1();
        pcStack_40 = (code *)0xcccccccccccccccd;
        uStack_50 = uv_buf_init(PING,5);
        handle = &((pinger_t_conflict *)udp)->udp;
        iVar1 = uv_udp_try_send(handle,&uStack_50,1,
                                (sockaddr *)&((pinger_t_conflict *)udp)->server_addr);
        if (-1 < iVar1) {
          return;
        }
        pinger_write_ping_cold_1();
        completed_pings = completed_pings + (long)*handle->data;
        completed_pingers = completed_pingers + 1;
        free(handle->data);
        return;
      }
      uVar3 = ((long)pinger->state + 1U) % 5;
      pinger->state = (int)uVar3;
      if (uVar3 == 0) {
        pinger->pongs = pinger->pongs + 1;
        pcStack_40 = (code *)0x10c40d;
        uVar2 = uv_now(loop);
        if (5000 < uVar2 - start_time) {
          uv_close((uv_handle_t *)local_38,pinger_close_cb);
          return;
        }
        pcStack_40 = (code *)0x10c424;
        udp = (uv_udp_t *)pinger;
        pinger_write_ping(pinger);
      }
      lVar4 = lVar4 + 1;
    } while (nread != lVar4);
  }
  return;
}

Assistant:

static void pinger_read_cb(uv_udp_t* udp,
                           ssize_t nread,
                           const uv_buf_t* buf,
                           const struct sockaddr* addr,
                           unsigned flags) {
  ssize_t i;
  pinger_t* pinger;
  pinger = (pinger_t*)udp->data;

  /* Now we count the pings */
  for (i = 0; i < nread; i++) {
    ASSERT(buf->base[i] == PING[pinger->state]);
    pinger->state = (pinger->state + 1) % (sizeof(PING) - 1);
    if (pinger->state == 0) {
      pinger->pongs++;
      if (uv_now(loop) - start_time > TIME) {
        uv_close((uv_handle_t*)udp, pinger_close_cb);
        break;
      }
      pinger_write_ping(pinger);
    }
  }

  buf_free(buf);
}